

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGen_X86.cpp
# Opt level: O2

void EMIT_OP_LABEL(CodeGenGenericContext *ctx,x86Command op,uint labelID,int invalidate,int longJump
                  )

{
  x86Instruction *pxVar1;
  
  if (op - o_jmp < 0xd) {
    if (invalidate == 0) goto LAB_0027b42d;
    if (longJump != 0) goto LAB_0027b41d;
  }
  else {
    if (op != o_call) {
      __assert_fail("!\"unknown instruction\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/CodeGen_X86.cpp"
                    ,0x355,
                    "void EMIT_OP_LABEL(CodeGenGenericContext &, x86Command, unsigned int, int, int)"
                   );
    }
LAB_0027b41d:
    CodeGenGenericContext::KillUnreadRegisters(ctx);
  }
  CodeGenGenericContext::InvalidateState(ctx);
LAB_0027b42d:
  pxVar1 = ctx->x86Op;
  pxVar1->name = op;
  (pxVar1->argA).type = argLabel;
  (pxVar1->argA).field_1.labelID = labelID;
  pxVar1 = ctx->x86Op;
  (pxVar1->argB).type = argNone;
  (pxVar1->argB).field_1.num = invalidate;
  pxVar1 = ctx->x86Op;
  (pxVar1->argB).ptrNum = longJump;
  ctx->x86Op = pxVar1 + 1;
  return;
}

Assistant:

void EMIT_OP_LABEL(CodeGenGenericContext &ctx, x86Command op, unsigned labelID, int invalidate, int longJump)
{
#ifdef NULLC_OPTIMIZE_X86
	switch(op)
	{
	case o_jmp:
	case o_ja:
	case o_jae:
	case o_jb:
	case o_jbe:
	case o_je:
	case o_jg:
	case o_jl:
	case o_jne:
	case o_jnp:
	case o_jp:
	case o_jge:
	case o_jle:
		if(invalidate)
		{
			if(longJump)
				ctx.KillUnreadRegisters();

			ctx.InvalidateState();
		}
		break;
	case o_call:
		ctx.KillUnreadRegisters();

		ctx.InvalidateState();
		break;
	default:
		assert(!"unknown instruction");
	}
#else
	switch(op)
	{
	case o_jmp:
	case o_ja:
	case o_jae:
	case o_jb:
	case o_jbe:
	case o_je:
	case o_jg:
	case o_jl:
	case o_jne:
	case o_jnp:
	case o_jp:
	case o_jge:
	case o_jle:
		if(invalidate)
			ctx.InvalidateState();
		break;
	case o_call:
		ctx.InvalidateState();
		break;
	}

	(void)longJump;
#endif

	ctx.x86Op->name = op;
	ctx.x86Op->argA.type = x86Argument::argLabel;
	ctx.x86Op->argA.labelID = labelID;
	ctx.x86Op->argB.type = x86Argument::argNone;
	ctx.x86Op->argB.num = invalidate;
	ctx.x86Op->argB.ptrNum = longJump;
	ctx.x86Op++;
}